

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::ReadQuadlet(BasePort *this,uchar boardId,nodeaddr_t addr,quadlet_t *data)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  
  bVar3 = boardId & 0x3f;
  if (bVar3 < 0x10) {
    uVar1 = this->Board2Node[bVar3];
    if (uVar1 < 0x40) {
LAB_0010cc70:
      iVar2 = (*this->_vptr_BasePort[4])(this,(ulong)uVar1);
      return SUB41(iVar2,0);
    }
  }
  else {
    uVar1 = 0x3f;
    if (bVar3 == 0x3f) goto LAB_0010cc70;
  }
  return false;
}

Assistant:

nodeid_t BasePort::ConvertBoardToNode(unsigned char boardId) const
{
    nodeid_t node = MAX_NODES;                  // Invalid value
    boardId = boardId&FW_NODE_MASK;
    if (boardId < BoardIO::MAX_BOARDS)
        node = GetNodeId(boardId);
    else if (boardId == FW_NODE_BROADCAST)
        node = FW_NODE_BROADCAST;
    return node;
}